

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int trytypeattr(rnndb *db,char *file,xmlNode *node,xmlAttr *attr,rnntypeinfo *ti)

{
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  rnntypeinfo *ti_local;
  xmlAttr *attr_local;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  iVar1 = strcmp((char *)attr->name,"shr");
  if (iVar1 == 0) {
    uVar2 = getnumattrib(db,file,(uint)node->line,attr);
    ti->shr = (int)uVar2;
    db_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp((char *)attr->name,"add");
    if (iVar1 == 0) {
      uVar2 = getnumattrib(db,file,(uint)node->line,attr);
      ti->add = (int)uVar2;
      db_local._4_4_ = 1;
    }
    else {
      iVar1 = strcmp((char *)attr->name,"min");
      if (iVar1 == 0) {
        uVar2 = getnumattrib(db,file,(uint)node->line,attr);
        ti->min = uVar2;
        ti->minvalid = 1;
        db_local._4_4_ = 1;
      }
      else {
        iVar1 = strcmp((char *)attr->name,"max");
        if (iVar1 == 0) {
          uVar2 = getnumattrib(db,file,(uint)node->line,attr);
          ti->max = uVar2;
          ti->maxvalid = 1;
          db_local._4_4_ = 1;
        }
        else {
          iVar1 = strcmp((char *)attr->name,"align");
          if (iVar1 == 0) {
            uVar2 = getnumattrib(db,file,(uint)node->line,attr);
            ti->align = uVar2;
            ti->alignvalid = 1;
            db_local._4_4_ = 1;
          }
          else {
            iVar1 = strcmp((char *)attr->name,"type");
            if (iVar1 == 0) {
              pcVar3 = getattrib(db,file,(uint)node->line,attr);
              pcVar3 = strdup(pcVar3);
              ti->name = pcVar3;
              db_local._4_4_ = 1;
            }
            else {
              iVar1 = strcmp((char *)attr->name,"radix");
              if (iVar1 == 0) {
                uVar2 = getnumattrib(db,file,(uint)node->line,attr);
                ti->radix = uVar2;
                ti->radixvalid = 1;
                db_local._4_4_ = 1;
              }
              else {
                db_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return db_local._4_4_;
}

Assistant:

static int trytypeattr (struct rnndb *db, char *file, xmlNode *node, xmlAttr *attr, struct rnntypeinfo *ti) {
	if (!strcmp(attr->name, "shr")) {
		ti->shr = getnumattrib(db, file, node->line, attr);
		return 1;
	} else if (!strcmp(attr->name, "add")) {
		ti->add = getnumattrib(db, file, node->line, attr);
		return 1;
	} else if (!strcmp(attr->name, "min")) {
		ti->min = getnumattrib(db, file, node->line, attr);
		ti->minvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "max")) {
		ti->max = getnumattrib(db, file, node->line, attr);
		ti->maxvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "align")) {
		ti->align = getnumattrib(db, file, node->line, attr);
		ti->alignvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "type")) {
		ti->name = strdup(getattrib(db, file, node->line, attr));;
		return 1;
	} else if (!strcmp(attr->name, "radix")) {
		ti->radix = getnumattrib(db, file, node->line, attr);
		ti->radixvalid = 1;
		return 1;
	}
	return 0;
}